

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O2

Gia_Man_t * Unr_ManUnrollSimple(Gia_Man_t *pGia,int nFrames)

{
  uint uVar1;
  int iLit0;
  int iLit1;
  Gia_Man_t *p;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  int iVar7;
  
  p = Gia_ManStart(10000);
  pcVar2 = Abc_UtilStrsav(pGia->pName);
  p->pName = pcVar2;
  Gia_ManHashAlloc(p);
  pGia->pObjs->Value = 0;
  iVar6 = 0;
  while ((iVar6 < pGia->nRegs &&
         (pGVar3 = Gia_ManCo(pGia,(pGia->vCos->nSize - pGia->nRegs) + iVar6),
         pGVar3 != (Gia_Obj_t *)0x0))) {
    pGVar3->Value = 0;
    iVar6 = iVar6 + 1;
  }
  iVar6 = 0;
  if (nFrames < 1) {
    nFrames = iVar6;
  }
  for (; iVar6 != nFrames; iVar6 = iVar6 + 1) {
    iVar7 = 0;
    while ((iVar7 < pGia->vCis->nSize - pGia->nRegs &&
           (pGVar3 = Gia_ManCi(pGia,iVar7), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar1 = Gia_ManAppendCi(p);
      pGVar3->Value = uVar1;
      iVar7 = iVar7 + 1;
    }
    iVar7 = 0;
    while (((iVar7 < pGia->nRegs &&
            (pGVar3 = Gia_ManCo(pGia,(pGia->vCos->nSize - pGia->nRegs) + iVar7),
            pGVar3 != (Gia_Obj_t *)0x0)) &&
           (pGVar4 = Gia_ManCi(pGia,(pGia->vCis->nSize - pGia->nRegs) + iVar7),
           pGVar4 != (Gia_Obj_t *)0x0))) {
      pGVar4->Value = pGVar3->Value;
      iVar7 = iVar7 + 1;
    }
    iVar7 = 0;
    while ((iVar7 < pGia->nObjs && (pGVar3 = Gia_ManObj(pGia,iVar7), pGVar3 != (Gia_Obj_t *)0x0))) {
      if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
        iLit0 = Gia_ObjFanin0Copy(pGVar3);
        uVar1 = (uint)((ulong)*(undefined8 *)pGVar3 >> 0x20);
        iLit1 = Abc_LitNotCond(pGVar3[-(ulong)(uVar1 & 0x1fffffff)].Value,uVar1 >> 0x1d & 1);
        uVar1 = Gia_ManHashAnd(p,iLit0,iLit1);
        pGVar3->Value = uVar1;
      }
      iVar7 = iVar7 + 1;
    }
    iVar7 = 0;
    while ((iVar7 < pGia->vCos->nSize &&
           (pGVar3 = Gia_ManCo(pGia,iVar7), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar1 = Gia_ObjFanin0Copy(pGVar3);
      pGVar3->Value = uVar1;
      iVar7 = iVar7 + 1;
    }
    iVar7 = 0;
    while ((iVar7 < pGia->vCos->nSize - pGia->nRegs &&
           (pGVar3 = Gia_ManCo(pGia,iVar7), pGVar3 != (Gia_Obj_t *)0x0))) {
      Gia_ManAppendCo(p,pGVar3->Value);
      iVar7 = iVar7 + 1;
    }
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,0);
  pGVar5 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar5;
}

Assistant:

Gia_Man_t * Unr_ManUnrollSimple( Gia_Man_t * pGia, int nFrames )
{
    Gia_Man_t * pFrames;
    Gia_Obj_t * pObj, * pObjRi;
    int f, i; 
    pFrames = Gia_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pGia->pName );
    Gia_ManHashAlloc( pFrames );
    Gia_ManConst0(pGia)->Value = 0;
    Gia_ManForEachRi( pGia, pObj, i )
        pObj->Value = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManForEachPi( pGia, pObj, i )
            pObj->Value = Gia_ManAppendCi(pFrames);
        Gia_ManForEachRiRo( pGia, pObjRi, pObj, i )
            pObj->Value = pObjRi->Value;
        Gia_ManForEachAnd( pGia, pObj, i )
            pObj->Value = Gia_ManHashAnd( pFrames, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( pGia, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachPo( pGia, pObj, i )
            Gia_ManAppendCo( pFrames, pObj->Value );
    }
    Gia_ManHashStop( pFrames );
    Gia_ManSetRegNum( pFrames, 0 );
    pFrames = Gia_ManCleanup( pGia = pFrames );
    Gia_ManStop( pGia );
    return pFrames;
}